

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O2

void __thiscall just::test::assert_throw::run<void(*)()>(assert_throw *this,_func_void *f_)

{
  allocator<char> local_31;
  string local_30;
  
  (*f_)();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Expression did not throw.",&local_31);
  assert_msg::operator()(&this->_assert_msg,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

impl::nothing_to_run run(F f_) const
      {
        try
        {
          f_();
        }
        catch (...)
        {
          return impl::nothing_to_run();
        }

        _assert_msg("Expression did not throw.", false);

        return impl::nothing_to_run();
      }